

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::FindRenderedTextEnd(char *text,char *text_end)

{
  char *pcVar1;
  char *pcVar2;
  char *text_display_end;
  
  pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
  pcVar1 = text;
  if (text < pcVar2) {
    do {
      if (*text == '#') {
        if (text[1] == '#') {
          return text;
        }
      }
      else if (*text == '\0') {
        return text;
      }
      text = text + 1;
      pcVar1 = pcVar2;
    } while (text != pcVar2);
  }
  return pcVar1;
}

Assistant:

const char* ImGui::FindRenderedTextEnd(const char* text, const char* text_end)
{
    const char* text_display_end = text;
    if (!text_end)
        text_end = (const char*)-1;

    while (text_display_end < text_end && *text_display_end != '\0' && (text_display_end[0] != '#' || text_display_end[1] != '#'))
        text_display_end++;
    return text_display_end;
}